

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O1

void wabt::WriteFixedS32Leb128(Stream *stream,uint32_t value,char *desc)

{
  byte bVar1;
  byte bVar2;
  undefined3 in_EAX;
  undefined8 uStack_8;
  
  bVar1 = (byte)(value >> 0x1c);
  bVar2 = bVar1 + 0x70;
  if (-1 < (int)value) {
    bVar2 = bVar1;
  }
  uStack_8 = CONCAT17(bVar2,CONCAT16((char)(value >> 0x15),
                                     CONCAT15((char)(value >> 0xe),
                                              CONCAT14((char)(value >> 7),
                                                       CONCAT13((char)value,in_EAX))))) |
             0x80808080000000;
  Stream::WriteData(stream,(void *)((long)&uStack_8 + 3),5,desc,No);
  return;
}

Assistant:

void WriteFixedS32Leb128(Stream* stream, uint32_t value, const char* desc) {
  uint8_t data[MAX_U32_LEB128_BYTES];
  data[0] = (value & 0x7f) | 0x80;
  data[1] = ((value >> 7) & 0x7f) | 0x80;
  data[2] = ((value >> 14) & 0x7f) | 0x80;
  data[3] = ((value >> 21) & 0x7f) | 0x80;
  // The last byte needs to be sign-extended.
  data[4] = ((value >> 28) & 0x0f);
  if (static_cast<int32_t>(value) < 0) {
    data[4] |= 0x70;
  }
  stream->WriteData(data, MAX_U32_LEB128_BYTES, desc);
}